

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  undefined1 uVar1;
  uint uVar2;
  buffer_appender<char> bVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  char *__first;
  buffer<char> *buf;
  ulong uVar8;
  ulong n;
  bool bVar9;
  
  uVar2 = *(uint *)&fspecs->field_0x4;
  uVar6 = uVar2 >> 8 & 0xff;
  uVar7 = 4 - (ulong)(uVar6 == 0);
  uVar8 = 0;
  if (uVar7 <= (uint)specs->width) {
    uVar8 = (uint)specs->width - uVar7;
  }
  n = uVar8 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar7 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + (specs->fill).size_ * uVar8) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,n,&specs->fill);
  if (uVar6 != 0) {
    uVar1 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)uVar6);
    lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    uVar7 = lVar4 + 1;
    if (*(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                  + 0x18) < uVar7) {
      (*(code *)**(undefined8 **)
                  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      lVar4 = *(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10);
      uVar7 = lVar4 + 1;
    }
    *(ulong *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
              0x10) = uVar7;
    *(undefined1 *)
     (*(long *)((long)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8
               ) + lVar4) = uVar1;
  }
  bVar9 = (uVar2 >> 0x10 & 1) == 0;
  pcVar5 = "INF";
  if (bVar9) {
    pcVar5 = "inf";
  }
  __first = "NAN";
  if (bVar9) {
    __first = "nan";
  }
  if (isinf) {
    __first = pcVar5;
  }
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>(__first,__first + 3,bVar3);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar3,uVar8 - n,&specs->fill);
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}